

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object.cpp
# Opt level: O0

void __thiscall
ON_ClassId::ConstructorHelper(ON_ClassId *this,char *sClassName,char *sBaseClassName,char *sUUID)

{
  bool bVar1;
  int iVar2;
  ON_ClassId *pOVar3;
  uchar extraout_RDX [8];
  uchar extraout_RDX_00 [8];
  uchar auVar4 [8];
  uchar extraout_RDX_01 [8];
  ON_UUID OVar5;
  ON_ClassId *local_68;
  ON_ClassId *p;
  int local_4c;
  char local_47 [3];
  int ver;
  ON_ClassId *pOStack_40;
  char s [7];
  ON_ClassId *duplicate_class;
  uchar local_30 [8];
  char *sUUID_local;
  char *sBaseClassName_local;
  char *sClassName_local;
  ON_ClassId *this_local;
  
  memset(this->m_sClassName,0,0x50);
  memset(this->m_sBaseClassName,0,0x50);
  OVar5 = ON_UuidFromString(sUUID);
  duplicate_class = OVar5._0_8_;
  *(ON_ClassId **)&this->m_uuid = duplicate_class;
  local_30 = OVar5.Data4;
  *&(this->m_uuid).Data4 = local_30;
  if (sClassName != (char *)0x0) {
    strncpy(this->m_sClassName,sClassName,0x4f);
  }
  if (sBaseClassName != (char *)0x0) {
    strncpy(this->m_sBaseClassName,sBaseClassName,0x4f);
  }
  pOVar3 = ClassId(this->m_sBaseClassName);
  this->m_pBaseClassId = pOVar3;
  if (this->m_sClassName[0] == '\0') {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_object.cpp"
               ,0x2e2,"","ON_ClassId::ON_ClassId() - missing class name");
  }
  else {
    pOStack_40 = ClassId(this->m_sClassName);
    auVar4 = extraout_RDX;
    if ((pOStack_40 != (ON_ClassId *)0x0) && (2 < m_mark0)) {
      ON_WarningEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_object.cpp"
                   ,0x2ee,"",
                   "ON_ClassId::ON_ClassId() - class name already in use.  Will append number to make it unique."
                  );
      auVar4 = extraout_RDX_00;
      for (local_4c = 1; local_4c < 10000 && pOStack_40 != (ON_ClassId *)0x0;
          local_4c = local_4c + 1) {
        IntToString(local_4c,local_47);
        ver._3_1_ = 0;
        strncpy(this->m_sClassName,sClassName,0x4f);
        strncat(this->m_sClassName,local_47,0x4f);
        pOStack_40 = ClassId(this->m_sClassName);
        auVar4 = extraout_RDX_01;
      }
    }
    if (pOStack_40 == (ON_ClassId *)0x0) {
      if (((((((this->m_sClassName[0] == 'O') && (this->m_sClassName[1] == 'N')) &&
             (this->m_sClassName[2] == '_')) &&
            (((this->m_sClassName[3] == 'O' && (this->m_sClassName[4] == 'b')) &&
             ((this->m_sClassName[5] == 'j' &&
              ((this->m_sClassName[6] == 'e' && (this->m_sClassName[7] == 'c')))))))) &&
           (this->m_sClassName[8] == 't')) && (this->m_sClassName[9] == '\0')) ||
         (this->m_sBaseClassName[0] != '\0')) {
        g_bDisableDemotion = true;
        OVar5.Data4[0] = auVar4[0];
        OVar5.Data4[1] = auVar4[1];
        OVar5.Data4[2] = auVar4[2];
        OVar5.Data4[3] = auVar4[3];
        OVar5.Data4[4] = auVar4[4];
        OVar5.Data4[5] = auVar4[5];
        OVar5.Data4[6] = auVar4[6];
        OVar5.Data4[7] = auVar4[7];
        OVar5._0_8_ = *(undefined8 *)(this->m_uuid).Data4;
        pOVar3 = ClassId(*(ON_ClassId **)&this->m_uuid,OVar5);
        if (pOVar3 == (ON_ClassId *)0x0) {
          g_bDisableDemotion = false;
          bVar1 = ON_UuidIsNil(&this->m_uuid);
          if (bVar1) {
            ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_object.cpp"
                       ,0x31b,"","ON_ClassId::ON_ClassId() - class uuid is nill.");
          }
          else {
            if (this->m_sClassName[0] != '\0') {
              for (local_68 = m_p0; local_68 != (ON_ClassId *)0x0; local_68 = local_68->m_pNext) {
                if ((((local_68->m_pBaseClassId == (ON_ClassId *)0x0) &&
                     (local_68->m_sBaseClassName[0] != '\0')) &&
                    (local_68->m_sBaseClassName[0x4f] == '\0')) &&
                   (iVar2 = strcmp(this->m_sClassName,local_68->m_sBaseClassName), iVar2 == 0)) {
                  local_68->m_pBaseClassId = this;
                }
              }
            }
            pOVar3 = this;
            if ((m_p0 != (ON_ClassId *)0x0) && (pOVar3 = this, m_p1 != (ON_ClassId *)0x0)) {
              m_p1->m_pNext = this;
              pOVar3 = m_p0;
            }
            m_p0 = pOVar3;
            m_p1 = this;
            this->m_pNext = (ON_ClassId *)0x0;
          }
        }
        else {
          g_bDisableDemotion = false;
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_object.cpp"
                     ,0x315,"","ON_ClassId::ON_ClassId() - class uuid already in use.");
        }
      }
      else {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_object.cpp"
                   ,0x30c,"","ON_ClassId::ON_ClassId() - missing baseclass name.");
      }
    }
    else {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_object.cpp"
                 ,0x2fc,"","ON_ClassId::ON_ClassId() - class name already in use.");
    }
  }
  return;
}

Assistant:

void ON_ClassId::ConstructorHelper( const char* sClassName, 
                        const char* sBaseClassName, 
                        const char* sUUID // UUID in registry format from guidgen
                        ) 
{
  // Do not initialize "m_class_id_version" or any fields
  // after it in this helper.  See comments in the constructors
  // for more information.
  memset( m_sClassName, 0, sizeof(m_sClassName) );
  memset( m_sBaseClassName, 0, sizeof(m_sBaseClassName) );
  m_uuid = ON_UuidFromString(sUUID);
  if ( sClassName ) {
    strncpy( m_sClassName, sClassName, sizeof(m_sClassName)-1 );
  }
  if ( sBaseClassName ) {
    strncpy( m_sBaseClassName, sBaseClassName, sizeof(m_sBaseClassName)-1 );
  }
  m_pBaseClassId = ClassId( m_sBaseClassName );

  if ( !m_sClassName[0] ) {
    ON_ERROR("ON_ClassId::ON_ClassId() - missing class name");
    return;
  }

  const ON_ClassId* duplicate_class = ClassId( m_sClassName );
  // The m_mark0 > 2 test prevents opennurbs and Rhino from
  // having two ON_Object derived classes that have the same
  // name.  Plug-ins are free to use any name.
  if ( 0 != duplicate_class && m_mark0 > 2 )
  {
    char s[7];
    int ver;
    ON_WARNING("ON_ClassId::ON_ClassId() - class name already in use.  Will append number to make it unique.");
    for ( ver = 1; ver < 10000 && 0 != duplicate_class; ver++ )
    {
      IntToString(ver,s);
      s[6] = 0;
      strncpy( m_sClassName, sClassName, sizeof(m_sClassName)-1 );
      strncat( m_sClassName, s, sizeof(m_sClassName)-1 );
      duplicate_class = ClassId( m_sClassName );
    }
  }

  if ( 0 != duplicate_class )
  {
    // Do NOT permit core classes to have duplicate names.
    ON_ERROR("ON_ClassId::ON_ClassId() - class name already in use.");
    return;
  }

  if (    m_sClassName[0] != 'O'
       || m_sClassName[1] != 'N'
       || m_sClassName[2] != '_'
       || m_sClassName[3] != 'O'
       || m_sClassName[4] != 'b'
       || m_sClassName[5] != 'j'
       || m_sClassName[6] != 'e'
       || m_sClassName[7] != 'c'
       || m_sClassName[8] != 't'
       || m_sClassName[9] != 0 ) {
    if ( !m_sBaseClassName[0] ) 
    {
      ON_ERROR("ON_ClassId::ON_ClassId() - missing baseclass name.");
      return;
    }
  }

  g_bDisableDemotion = true;
  if ( ClassId( m_uuid ) ) 
  {
    g_bDisableDemotion = false;
    ON_ERROR("ON_ClassId::ON_ClassId() - class uuid already in use.");
    return;
  }
  g_bDisableDemotion = false;

  if ( ON_UuidIsNil( m_uuid ) ) {
    ON_ERROR("ON_ClassId::ON_ClassId() - class uuid is nill.");
    return;
  }

  // see if any derived classes need to be updated because their static
  // members got initialized first
  if ( m_sClassName[0] ) 
  {
    for ( ON_ClassId* p = m_p0; p; p = p->m_pNext )
    {
      if ( 
        0 == p->m_pBaseClassId 
        && 0 != p->m_sBaseClassName[0] 
        && 0 == p->m_sBaseClassName[sizeof(p->m_sBaseClassName)/sizeof(p->m_sBaseClassName[0]) - 1] 
        )
      {
        if ( 0 == strcmp( m_sClassName, p->m_sBaseClassName ) )
          p->m_pBaseClassId = this;
      }
    }
  }

  // Append to the list of class ids
  if ( m_p0 && m_p1 )
  {
    m_p1->m_pNext = this;
    m_p1 = this;
  }
  else
  {
    // first class id
    m_p0 = this;
  }
  m_p1 = this;
  m_p1->m_pNext = 0;
}